

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O1

NodeIt __thiscall trieste::NodeDef::insert(NodeDef *this,NodeIt pos,NodeIt first,NodeIt last)

{
  NodeDef *this_00;
  pointer psVar1;
  NodeIt it;
  NodeIt NVar2;
  
  NVar2._M_current = first._M_current;
  if (first._M_current != last._M_current) {
    do {
      this_00 = ((NVar2._M_current)->
                super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this_00->parent_ = this;
      add_flags(this_00);
      NVar2._M_current = NVar2._M_current + 1;
    } while (NVar2._M_current != last._M_current);
    psVar1 = (this->children).
             super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>
    ::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>
              ((vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>
                *)&this->children,pos._M_current,first._M_current,last._M_current);
    pos._M_current =
         (shared_ptr<trieste::NodeDef> *)
         ((long)pos._M_current +
         ((long)(this->children).
                super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                ._M_impl.super__Vector_impl_data._M_start - (long)psVar1));
  }
  return (NodeIt)pos._M_current;
}

Assistant:

NodeIt insert(NodeIt pos, NodeIt first, NodeIt last)
    {
      if (first == last)
        return pos;

      for (auto it = first; it != last; ++it)
      {
        (*it)->parent_ = this;
        (*it)->add_flags();
      }

      return children.insert(pos, first, last);
    }